

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Aig_Man_t * Abc_NtkToDar(Abc_Ntk_t *pNtk,int fExors,int fRegisters)

{
  ulong *puVar1;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar2;
  uint uVar3;
  int iVar4;
  Abc_Obj_t *pAVar5;
  Abc_Ntk_t *pLatch;
  Aig_Man_t *p;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  Abc_Obj_t *p1;
  void *pvVar9;
  Vec_Int_t *pVVar10;
  Vec_Ptr_t *p_00;
  int *Entry;
  void *__dest;
  ulong uVar11;
  ulong uVar12;
  Abc_Ntk_t *pAVar13;
  Aig_Man_t *pAVar14;
  size_t __size;
  long lVar15;
  int iVar16;
  
  if (fRegisters != 0) {
    if (pNtk->vBoxes->nSize != pNtk->nObjCounts[8]) {
      __assert_fail("Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                    ,0xf3,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
    }
    pAVar13 = pNtk;
    for (iVar16 = 0; iVar16 < pNtk->vCis->nSize; iVar16 = iVar16 + 1) {
      pAVar13 = pNtk;
      pAVar5 = Abc_NtkCi(pNtk,iVar16);
      uVar3 = *(uint *)&pAVar5->field_0x14 & 0xf;
      if (iVar16 < pNtk->vPis->nSize) {
        if (uVar3 != 2) {
          __assert_fail("Abc_ObjIsPi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                        ,0xf7,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
        }
      }
      else if (uVar3 != 5) {
        __assert_fail("Abc_ObjIsBo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                      ,0xfc,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
      }
    }
    for (iVar16 = 0; iVar16 < pNtk->vCos->nSize; iVar16 = iVar16 + 1) {
      pAVar13 = pNtk;
      pAVar5 = Abc_NtkCo(pNtk,iVar16);
      uVar3 = *(uint *)&pAVar5->field_0x14 & 0xf;
      if (iVar16 < pNtk->vPos->nSize) {
        if (uVar3 != 3) {
          __assert_fail("Abc_ObjIsPo(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                        ,0x100,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
        }
      }
      else if (uVar3 != 4) {
        __assert_fail("Abc_ObjIsBi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                      ,0x105,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
      }
    }
    uVar3 = 0;
    for (iVar16 = 0; iVar4 = (int)pAVar13, iVar16 < pNtk->vBoxes->nSize; iVar16 = iVar16 + 1) {
      pAVar13 = pNtk;
      pLatch = (Abc_Ntk_t *)Abc_NtkBox(pNtk,iVar16);
      if (((ulong)pLatch->pSpec & 0xf00000000) == 0x800000000) {
        pAVar13 = pLatch;
        iVar4 = Abc_LatchIsInitDc((Abc_Obj_t *)pLatch);
        if (iVar4 != 0) {
          Abc_LatchSetInit0((Abc_Obj_t *)pLatch);
          uVar3 = uVar3 + 1;
          pAVar13 = pLatch;
        }
      }
    }
    if (uVar3 != 0) {
      Abc_Print(iVar4,"Warning: %d registers in this network have don\'t-care init values.\n",
                (ulong)uVar3);
      Abc_Print(iVar4,"The don\'t-care are assumed to be 0. The result may not verify.\n");
      Abc_Print(iVar4,"Use command \"print_latch\" to see the init values of registers.\n");
      Abc_Print(iVar4,"Use command \"zero\" to convert or \"init\" to change the values.\n");
    }
  }
  p = Aig_ManStart(pNtk->nObjCounts[7] + 100);
  p->fCatchExor = fExors;
  iVar16 = pNtk->nBarBufs;
  p->nConstrs = pNtk->nConstrs;
  p->nBarBufs = iVar16;
  pcVar6 = Extra_UtilStrsav(pNtk->pName);
  p->pName = pcVar6;
  pcVar6 = Extra_UtilStrsav(pNtk->pSpec);
  p->pSpec = pcVar6;
  aVar2 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)p->pConst1;
  pAVar5 = Abc_AigConst1(pNtk);
  pAVar5->field_6 = aVar2;
  for (iVar16 = 0; iVar16 < pNtk->vCis->nSize; iVar16 = iVar16 + 1) {
    pAVar5 = Abc_NtkCi(pNtk,iVar16);
    pAVar7 = (Abc_Obj_t *)Aig_ObjCreateCi(p);
    (pAVar5->field_6).pCopy = pAVar7;
    uVar12._0_4_ = (pAVar7->vFanins).nCap;
    uVar12._4_4_ = (pAVar7->vFanins).nSize;
    uVar12 = uVar12 & 0xff000000ffffffff | (ulong)(*(uint *)&pAVar5->field_0x14 >> 0xc) << 0x20;
    (pAVar7->vFanins).nCap = (int)uVar12;
    (pAVar7->vFanins).nSize = (int)(uVar12 >> 0x20);
  }
  if (fRegisters != 0) {
    for (iVar16 = 0; iVar16 < pNtk->vBoxes->nSize; iVar16 = iVar16 + 1) {
      pAVar5 = Abc_NtkBox(pNtk,iVar16);
      if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
        iVar4 = Abc_LatchIsInit1(pAVar5);
        if (iVar4 != 0) {
          puVar1 = (ulong *)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray] + 0x40);
          *puVar1 = *puVar1 ^ 1;
        }
      }
    }
  }
  pVVar8 = Abc_NtkDfs(pNtk,0);
  for (iVar16 = 0; iVar16 < pVVar8->nSize; iVar16 = iVar16 + 1) {
    pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(pVVar8,iVar16);
    pAVar7 = Abc_ObjChild0Copy(pAVar5);
    p1 = Abc_ObjChild1Copy(pAVar5);
    pAVar7 = (Abc_Obj_t *)Aig_And(p,(Aig_Obj_t *)pAVar7,(Aig_Obj_t *)p1);
    (pAVar5->field_6).pCopy = pAVar7;
  }
  Vec_PtrFree(pVVar8);
  p->fAddStrash = 0;
  for (iVar16 = 0; iVar16 < pNtk->vCos->nSize; iVar16 = iVar16 + 1) {
    pAVar5 = Abc_NtkCo(pNtk,iVar16);
    pAVar5 = Abc_ObjChild0Copy(pAVar5);
    Aig_ObjCreateCo(p,(Aig_Obj_t *)pAVar5);
  }
  Aig_ManSetRegNum(p,pNtk->nObjCounts[8]);
  if (fRegisters != 0) {
    for (iVar16 = p->nObjs[3] - p->nRegs; iVar16 < p->vCos->nSize; iVar16 = iVar16 + 1) {
      pvVar9 = Vec_PtrEntry(p->vCos,iVar16);
      pAVar5 = Abc_NtkCo(pNtk,iVar16);
      iVar4 = Abc_LatchIsInit1((Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray])
      ;
      if (iVar4 != 0) {
        *(byte *)((long)pvVar9 + 8) = *(byte *)((long)pvVar9 + 8) ^ 1;
      }
    }
  }
  iVar16 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar16 == 0) {
    pAVar14 = p;
    uVar3 = Aig_ManCleanup(p);
    if ((fExors == 0) && (uVar3 != 0)) {
      Abc_Print((int)pAVar14,
                "Abc_NtkToDar(): Unexpected %d dangling nodes when converting to AIG!\n",
                (ulong)uVar3);
    }
  }
  if (fRegisters != 0) {
    Aig_ManSetRegNum(p,pNtk->nObjCounts[8]);
    uVar3 = p->nRegs;
    pVVar10 = Vec_IntAlloc(uVar3);
    pVVar10->nSize = uVar3;
    uVar11 = 0;
    uVar12 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar12 = uVar11;
    }
    for (; uVar12 != uVar11; uVar11 = uVar11 + 1) {
      pVVar10->pArray[uVar11] = (int)uVar11;
    }
    p->vFlopNums = pVVar10;
    pVVar8 = pNtk->vOnehots;
    if (pVVar8 != (Vec_Ptr_t *)0x0) {
      p_00 = Vec_PtrAlloc(pVVar8->nSize);
      for (lVar15 = 0; lVar15 < pVVar8->nSize; lVar15 = lVar15 + 1) {
        pvVar9 = pVVar8->pArray[lVar15];
        Entry = (int *)malloc(0x10);
        iVar16 = *(int *)((long)pvVar9 + 4);
        Entry[1] = iVar16;
        *Entry = iVar16;
        if ((long)iVar16 == 0) {
          __size = 0;
          __dest = (void *)0x0;
        }
        else {
          __size = (long)iVar16 << 2;
          __dest = malloc(__size);
        }
        *(void **)(Entry + 2) = __dest;
        memcpy(__dest,*(void **)((long)pvVar9 + 8),__size);
        Vec_PtrPush(p_00,Entry);
      }
      p->vOnehots = p_00;
    }
  }
  pAVar14 = p;
  iVar16 = Aig_ManCheck(p);
  if (iVar16 == 0) {
    Abc_Print((int)pAVar14,"Abc_NtkToDar: AIG check has failed.\n");
    Aig_ManStop(p);
    p = (Aig_Man_t *)0x0;
  }
  return p;
}

Assistant:

Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters )
{
    Vec_Ptr_t * vNodes;
    Aig_Man_t * pMan;
    Aig_Obj_t * pObjNew;
    Abc_Obj_t * pObj;
    int i, nNodes, nDontCares;
    // make sure the latches follow PIs/POs
    if ( fRegisters ) 
    { 
        assert( Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk) );
        Abc_NtkForEachCi( pNtk, pObj, i )
            if ( i < Abc_NtkPiNum(pNtk) )
            {
                assert( Abc_ObjIsPi(pObj) );
                if ( !Abc_ObjIsPi(pObj) )
                    Abc_Print( 1, "Abc_NtkToDar(): Temporary bug: The PI ordering is wrong!\n" );
            }
            else
                assert( Abc_ObjIsBo(pObj) );
        Abc_NtkForEachCo( pNtk, pObj, i )
            if ( i < Abc_NtkPoNum(pNtk) )
            {
                assert( Abc_ObjIsPo(pObj) );
                if ( !Abc_ObjIsPo(pObj) )
                    Abc_Print( 1, "Abc_NtkToDar(): Temporary bug: The PO ordering is wrong!\n" );
            }
            else
                assert( Abc_ObjIsBi(pObj) );
        // print warning about initial values
        nDontCares = 0;
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( Abc_LatchIsInitDc(pObj) )
            {
                Abc_LatchSetInit0(pObj);
                nDontCares++;
            }
        if ( nDontCares )
        {
            Abc_Print( 1, "Warning: %d registers in this network have don't-care init values.\n", nDontCares );
            Abc_Print( 1, "The don't-care are assumed to be 0. The result may not verify.\n" );
            Abc_Print( 1, "Use command \"print_latch\" to see the init values of registers.\n" );
            Abc_Print( 1, "Use command \"zero\" to convert or \"init\" to change the values.\n" );
        }
    }
    // create the manager
    pMan = Aig_ManStart( Abc_NtkNodeNum(pNtk) + 100 );
    pMan->fCatchExor = fExors;
    pMan->nConstrs = pNtk->nConstrs;
    pMan->nBarBufs = pNtk->nBarBufs;
    pMan->pName = Extra_UtilStrsav( pNtk->pName );
    pMan->pSpec = Extra_UtilStrsav( pNtk->pSpec );
    // transfer the pointers to the basic nodes
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)Aig_ManConst1(pMan);
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pObj->pCopy = (Abc_Obj_t *)Aig_ObjCreateCi(pMan);
        // initialize logic level of the CIs
        ((Aig_Obj_t *)pObj->pCopy)->Level = pObj->Level;
    }

    // complement the 1-values registers
    if ( fRegisters ) {
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( Abc_LatchIsInit1(pObj) )
                Abc_ObjFanout0(pObj)->pCopy = Abc_ObjNot(Abc_ObjFanout0(pObj)->pCopy);
    }
    // perform the conversion of the internal nodes (assumes DFS ordering)
//    pMan->fAddStrash = 1;
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
//    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pObj->pCopy = (Abc_Obj_t *)Aig_And( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj), (Aig_Obj_t *)Abc_ObjChild1Copy(pObj) );
//        Abc_Print( 1, "%d->%d ", pObj->Id, ((Aig_Obj_t *)pObj->pCopy)->Id );
    }
    Vec_PtrFree( vNodes );
    pMan->fAddStrash = 0;
    // create the POs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Aig_ObjCreateCo( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj) );
    // complement the 1-valued registers
    Aig_ManSetRegNum( pMan, Abc_NtkLatchNum(pNtk) );
    if ( fRegisters )
        Aig_ManForEachLiSeq( pMan, pObjNew, i )
            if ( Abc_LatchIsInit1(Abc_ObjFanout0(Abc_NtkCo(pNtk,i))) )
                pObjNew->pFanin0 = Aig_Not(pObjNew->pFanin0);
    // remove dangling nodes
    nNodes = (Abc_NtkGetChoiceNum(pNtk) == 0)? Aig_ManCleanup( pMan ) : 0;
    if ( !fExors && nNodes )
        Abc_Print( 1, "Abc_NtkToDar(): Unexpected %d dangling nodes when converting to AIG!\n", nNodes );
//Aig_ManDumpVerilog( pMan, "test.v" );
    // save the number of registers
    if ( fRegisters )
    {
        Aig_ManSetRegNum( pMan, Abc_NtkLatchNum(pNtk) );
        pMan->vFlopNums = Vec_IntStartNatural( pMan->nRegs );
//        pMan->vFlopNums = NULL;
//        pMan->vOnehots = Abc_NtkConverLatchNamesIntoNumbers( pNtk );
        if ( pNtk->vOnehots )
            pMan->vOnehots = (Vec_Ptr_t *)Vec_VecDupInt( (Vec_Vec_t *)pNtk->vOnehots );
    }
    if ( !Aig_ManCheck( pMan ) )
    {
        Abc_Print( 1, "Abc_NtkToDar: AIG check has failed.\n" );
        Aig_ManStop( pMan );
        return NULL;
    }
    return pMan;
}